

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Visitor.h
# Opt level: O2

void hiberlite::access::destroy<hiberlite::ModelExtractor,Person>(ModelExtractor *param_1,Person *c)

{
  if (c != (Person *)0x0) {
    Person::~Person(c);
  }
  operator_delete(c);
  return;
}

Assistant:

static void destroy(A& /*a*/, C* c)
	{
		delete c;
	}